

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

u32 whereIsCoveringIndex(WhereInfo *pWInfo,Index *pIdx,int iTabCur)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  CoveringIndexCheck ck;
  Walker w;
  Index *local_48;
  int local_40;
  Walker local_38;
  
  uVar3 = 1;
  if (pWInfo->pSelect != (Select *)0x0) {
    uVar4 = (ulong)pIdx->nColumn;
    bVar6 = uVar4 != 0;
    if (bVar6) {
      local_38.u.pNC = (NameContext *)&local_48;
      if (*pIdx->aiColumn < 0x3f) {
        uVar5 = 0;
        do {
          if (uVar4 - 1 == uVar5) {
            return 1;
          }
          uVar1 = uVar5 + 1;
          lVar2 = uVar5 + 1;
          uVar5 = uVar1;
        } while (pIdx->aiColumn[lVar2] < 0x3f);
        bVar6 = uVar1 < uVar4;
      }
      uVar3 = 1;
      if (bVar6) {
        local_38.pParse = (Parse *)0x0;
        local_38.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
        local_38.xExprCallback = whereIsCoveringIndexWalkCallback;
        local_38.xSelectCallback = sqlite3SelectWalkNoop;
        local_38.walkerDepth = 0;
        local_38.eCode = 0;
        local_38._38_2_ = 0;
        local_48 = pIdx;
        local_40 = iTabCur;
        sqlite3WalkSelect(&local_38,pWInfo->pSelect);
        uVar3 = (uint)local_38.eCode;
      }
    }
  }
  return uVar3;
}

Assistant:

static SQLITE_NOINLINE u32 whereIsCoveringIndex(
  WhereInfo *pWInfo,     /* The WHERE clause context */
  Index *pIdx,           /* Index that is being tested */
  int iTabCur            /* Cursor for the table being indexed */
){
  int i;
  struct CoveringIndexCheck ck;
  Walker w;
  if( pWInfo->pSelect==0 ){
    /* We don't have access to the full query, so we cannot check to see
    ** if pIdx is covering.  Assume it is not. */
    return 1;
  }
  for(i=0; i<pIdx->nColumn; i++){
    if( pIdx->aiColumn[i]>=BMS-1 ) break;
  }
  if( i>=pIdx->nColumn ){
    /* pIdx does not index any columns greater than 62, but we know from
    ** colMask that columns greater than 62 are used, so this is not a
    ** covering index */
    return 1;
  }
  ck.pIdx = pIdx;
  ck.iTabCur = iTabCur;
  memset(&w, 0, sizeof(w));
  w.xExprCallback = whereIsCoveringIndexWalkCallback;
  w.xSelectCallback = sqlite3SelectWalkNoop;
  w.u.pCovIdxCk = &ck;
  w.eCode = 0;
  sqlite3WalkSelect(&w, pWInfo->pSelect);
  return w.eCode;
}